

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

void __thiscall ssl_session_st::ssl_session_st(ssl_session_st *this,SSL_X509_METHOD *method)

{
  time_t tVar1;
  CRYPTO_EX_DATA *ad;
  SSL_X509_METHOD *obj;
  uchar *local_70;
  SSL_X509_METHOD *method_local;
  ssl_session_st *this_local;
  
  obj = method;
  bssl::RefCounted<ssl_session_st>::RefCounted();
  *(undefined2 *)&this->key_arg_length = 0;
  *(undefined2 *)((long)&this->key_arg_length + 2) = 0;
  this->key_arg[0] = '\0';
  this->key_arg[1] = '\0';
  bssl::InplaceVector<unsigned_char,_64UL>::InplaceVector
            ((InplaceVector<unsigned_char,_64UL> *)(this->key_arg + 2));
  bssl::InplaceVector<unsigned_char,_32UL>::InplaceVector
            ((InplaceVector<unsigned_char,_32UL> *)(this->session_id + 3));
  bssl::InplaceVector<unsigned_char,_32UL>::InplaceVector
            ((InplaceVector<unsigned_char,_32UL> *)this->sid_ctx);
  std::unique_ptr<char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<char,bssl::internal::Deleter> *)this->krb5_client_princ);
  std::unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter> *)
             (this->krb5_client_princ + 8));
  *(SSL_X509_METHOD **)(this->krb5_client_princ + 0x10) = method;
  this->krb5_client_princ[0x18] = '\0';
  this->krb5_client_princ[0x19] = '\0';
  this->krb5_client_princ[0x1a] = '\0';
  this->krb5_client_princ[0x1b] = '\0';
  this->krb5_client_princ[0x1c] = '\0';
  this->krb5_client_princ[0x1d] = '\0';
  this->krb5_client_princ[0x1e] = '\0';
  this->krb5_client_princ[0x1f] = '\0';
  this->krb5_client_princ[0x20] = '\0';
  this->krb5_client_princ[0x21] = '\0';
  this->krb5_client_princ[0x22] = '\0';
  this->krb5_client_princ[0x23] = '\0';
  this->krb5_client_princ[0x24] = '\0';
  this->krb5_client_princ[0x25] = '\0';
  this->krb5_client_princ[0x26] = '\0';
  this->krb5_client_princ[0x27] = '\0';
  this->krb5_client_princ[0x28] = '\0';
  this->krb5_client_princ[0x29] = '\0';
  this->krb5_client_princ[0x2a] = '\0';
  this->krb5_client_princ[0x2b] = '\0';
  this->krb5_client_princ[0x2c] = '\0';
  this->krb5_client_princ[0x2d] = '\0';
  this->krb5_client_princ[0x2e] = '\0';
  this->krb5_client_princ[0x2f] = '\0';
  this->krb5_client_princ[0x30] = 'A';
  this->krb5_client_princ[0x31] = '\0';
  this->krb5_client_princ[0x32] = '\0';
  this->krb5_client_princ[0x33] = '\0';
  this->krb5_client_princ[0x34] = '\0';
  this->krb5_client_princ[0x35] = '\0';
  this->krb5_client_princ[0x36] = '\0';
  this->krb5_client_princ[0x37] = '\0';
  this->krb5_client_princ[0x38] = ' ';
  this->krb5_client_princ[0x39] = '\x1c';
  this->krb5_client_princ[0x3a] = '\0';
  this->krb5_client_princ[0x3b] = '\0';
  this->krb5_client_princ[0x3c] = ' ';
  this->krb5_client_princ[0x3d] = '\x1c';
  this->krb5_client_princ[0x3e] = '\0';
  this->krb5_client_princ[0x3f] = '\0';
  this->krb5_client_princ[0x40] = '\0';
  this->krb5_client_princ[0x41] = '\0';
  this->krb5_client_princ[0x42] = '\0';
  this->krb5_client_princ[0x43] = '\0';
  this->krb5_client_princ[0x44] = '\0';
  this->krb5_client_princ[0x45] = '\0';
  this->krb5_client_princ[0x46] = '\0';
  this->krb5_client_princ[0x47] = '\0';
  this->krb5_client_princ[0x48] = '\0';
  this->krb5_client_princ[0x49] = '\0';
  this->krb5_client_princ[0x4a] = '\0';
  this->krb5_client_princ[0x4b] = '\0';
  this->krb5_client_princ[0x4c] = '\0';
  this->krb5_client_princ[0x4d] = '\0';
  this->krb5_client_princ[0x4e] = '\0';
  this->krb5_client_princ[0x4f] = '\0';
  this->krb5_client_princ[0x58] = '\0';
  this->krb5_client_princ[0x59] = '\0';
  this->krb5_client_princ[0x5a] = '\0';
  this->krb5_client_princ[0x5b] = '\0';
  this->krb5_client_princ[0x5c] = '\0';
  this->krb5_client_princ[0x5d] = '\0';
  this->krb5_client_princ[0x5e] = '\0';
  this->krb5_client_princ[0x5f] = '\0';
  this->krb5_client_princ[0x60] = '\0';
  this->krb5_client_princ[0x61] = '\0';
  this->krb5_client_princ[0x62] = '\0';
  this->krb5_client_princ[99] = '\0';
  this->krb5_client_princ[100] = '\0';
  this->krb5_client_princ[0x65] = '\0';
  this->krb5_client_princ[0x66] = '\0';
  this->krb5_client_princ[0x67] = '\0';
  bssl::Array<unsigned_char>::Array((Array<unsigned_char> *)(this->krb5_client_princ + 0x68));
  std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)
             (this->krb5_client_princ + 0x78));
  std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)
             (this->krb5_client_princ + 0x80));
  this->krb5_client_princ[0x88] = '\0';
  local_70 = this->krb5_client_princ + 0x89;
  do {
    *local_70 = '\0';
    local_70 = local_70 + 1;
  } while (local_70 != this->krb5_client_princ + 0xa8);
  bssl::InplaceVector<unsigned_char,_64UL>::InplaceVector
            ((InplaceVector<unsigned_char,_64UL> *)(this->krb5_client_princ + 0xa8));
  this->krb5_client_princ[0xec] = '\0';
  this->krb5_client_princ[0xed] = '\0';
  this->krb5_client_princ[0xee] = '\0';
  this->krb5_client_princ[0xef] = '\0';
  this->krb5_client_princ[0xf0] = '\0';
  this->krb5_client_princ[0xf1] = '\0';
  this->krb5_client_princ[0xf2] = '\0';
  this->krb5_client_princ[0xf3] = '\0';
  this->krb5_client_princ[0xf4] = '\0';
  this->krb5_client_princ[0xf5] = '\0';
  this->krb5_client_princ[0xf6] = '\0';
  this->krb5_client_princ[0xf7] = '\0';
  bssl::Array<unsigned_char>::Array((Array<unsigned_char> *)(this->krb5_client_princ + 0xf8));
  bssl::Array<unsigned_char>::Array((Array<unsigned_char> *)&this->psk_identity);
  bssl::Array<unsigned_char>::Array((Array<unsigned_char> *)&this->sess_cert);
  *(byte *)&this->verify_result = (byte)this->verify_result & 0xfe;
  *(byte *)&this->verify_result = (byte)this->verify_result & 0xfd;
  *(byte *)&this->verify_result = (byte)this->verify_result & 0xfb;
  *(byte *)&this->verify_result = (byte)this->verify_result & 0xf7;
  *(byte *)&this->verify_result = (byte)this->verify_result & 0xef;
  *(byte *)&this->verify_result = (byte)this->verify_result & 0xdf;
  *(byte *)&this->verify_result = (byte)this->verify_result & 0xbf;
  *(byte *)&this->verify_result = (byte)this->verify_result & 0x7f;
  bssl::Array<unsigned_char>::Array((Array<unsigned_char> *)&this->references);
  CRYPTO_new_ex_data((int)this + 0xe0,obj,ad);
  tVar1 = time((time_t *)0x0);
  *(time_t *)(this->krb5_client_princ + 0x40) = tVar1;
  return;
}

Assistant:

ssl_session_st::ssl_session_st(const SSL_X509_METHOD *method)
    : RefCounted(CheckSubClass()),
      x509_method(method),
      extended_master_secret(false),
      peer_sha256_valid(false),
      not_resumable(false),
      ticket_age_add_valid(false),
      is_server(false),
      is_quic(false),
      has_application_settings(false),
      is_resumable_across_names(false) {
  CRYPTO_new_ex_data(&ex_data);
  time = ::time(nullptr);
}